

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

bool __thiscall
jpge::jpeg_encoder::jpg_open(jpeg_encoder *this,int p_x_res,int p_y_res,int src_channels)

{
  bool bVar1;
  uint8 *puVar2;
  int16 *local_48;
  int local_28;
  int i;
  int src_channels_local;
  int p_y_res_local;
  int p_x_res_local;
  jpeg_encoder *this_local;
  
  this->m_num_components = '\x03';
  switch((this->m_params).m_subsampling) {
  case Y_ONLY:
    this->m_num_components = '\x01';
    this->m_comp_h_samp[0] = '\x01';
    this->m_comp_v_samp[0] = '\x01';
    this->m_mcu_x = 8;
    this->m_mcu_y = 8;
    break;
  case H1V1:
    this->m_comp_h_samp[0] = '\x01';
    this->m_comp_v_samp[0] = '\x01';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_mcu_x = 8;
    this->m_mcu_y = 8;
    break;
  case H2V1:
    this->m_comp_h_samp[0] = '\x02';
    this->m_comp_v_samp[0] = '\x01';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_mcu_x = 0x10;
    this->m_mcu_y = 8;
    break;
  case H2V2:
    this->m_comp_h_samp[0] = '\x02';
    this->m_comp_v_samp[0] = '\x02';
    this->m_comp_h_samp[1] = '\x01';
    this->m_comp_v_samp[1] = '\x01';
    this->m_comp_h_samp[2] = '\x01';
    this->m_comp_v_samp[2] = '\x01';
    this->m_mcu_x = 0x10;
    this->m_mcu_y = 0x10;
  }
  this->m_image_x = p_x_res;
  this->m_image_y = p_y_res;
  this->m_image_bpp = src_channels;
  this->m_image_bpl = this->m_image_x * src_channels;
  this->m_image_x_mcu = (this->m_image_x + this->m_mcu_x) - 1U & (this->m_mcu_x - 1U ^ 0xffffffff);
  this->m_image_y_mcu = (this->m_image_y + this->m_mcu_y) - 1U & (this->m_mcu_y - 1U ^ 0xffffffff);
  this->m_image_bpl_xlt = this->m_image_x * (uint)this->m_num_components;
  this->m_image_bpl_mcu = this->m_image_x_mcu * (uint)this->m_num_components;
  this->m_mcus_per_row = this->m_image_x_mcu / this->m_mcu_x;
  puVar2 = (uint8 *)jpge_malloc((long)(this->m_image_bpl_mcu * this->m_mcu_y));
  this->m_mcu_lines[0] = puVar2;
  if (puVar2 == (uint8 *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    for (local_28 = 1; local_28 < this->m_mcu_y; local_28 = local_28 + 1) {
      this->m_mcu_lines[local_28] = this->m_mcu_lines[local_28 + -1] + this->m_image_bpl_mcu;
    }
    if (((this->m_params).m_use_std_tables & 1U) == 0) {
      compute_quant_table(this,this->m_quantization_tables[0],(int16 *)s_alt_quant);
      memcpy(this->m_quantization_tables + 1,this->m_quantization_tables,0x100);
    }
    else {
      compute_quant_table(this,this->m_quantization_tables[0],(int16 *)s_std_lum_quant);
      if (((this->m_params).m_no_chroma_discrim_flag & 1U) == 0) {
        local_48 = (int16 *)s_std_croma_quant;
      }
      else {
        local_48 = (int16 *)s_std_lum_quant;
      }
      compute_quant_table(this,this->m_quantization_tables[1],local_48);
    }
    this->m_out_buf_left = 0x800;
    this->m_pOut_buf = this->m_out_buf;
    if (((this->m_params).m_two_pass_flag & 1U) == 0) {
      *(undefined8 *)this->m_huff_bits[0] = s_dc_lum_bits;
      *(undefined8 *)(this->m_huff_bits[0] + 8) = DAT_0026a9d8;
      this->m_huff_bits[0][0x10] = DAT_0026a9e0;
      *(undefined8 *)this->m_huff_val[0] = s_dc_lum_val;
      *(undefined4 *)(this->m_huff_val[0] + 8) = DAT_0026a9e9;
      *(undefined8 *)this->m_huff_bits[2] = s_ac_lum_bits;
      *(undefined8 *)(this->m_huff_bits[2] + 8) = DAT_0026a9f8;
      this->m_huff_bits[2][0x10] = DAT_0026aa00;
      memcpy(this->m_huff_val + 2,s_ac_lum_val,0x100);
      *(undefined8 *)this->m_huff_bits[1] = s_dc_chroma_bits;
      *(undefined8 *)(this->m_huff_bits[1] + 8) = DAT_0026aa18;
      this->m_huff_bits[1][0x10] = DAT_0026aa20;
      *(undefined8 *)this->m_huff_val[1] = s_dc_chroma_val;
      *(undefined4 *)(this->m_huff_val[1] + 8) = DAT_0026aa29;
      *(undefined8 *)this->m_huff_bits[3] = s_ac_chroma_bits;
      *(undefined8 *)(this->m_huff_bits[3] + 8) = DAT_0026aa38;
      this->m_huff_bits[3][0x10] = DAT_0026aa40;
      memcpy(this->m_huff_val + 3,s_ac_chroma_val,0x100);
      bVar1 = second_pass_init(this);
      if (!bVar1) {
        return false;
      }
    }
    else {
      clear_obj<unsigned_int[4][256]>((uint (*) [4] [256])this->m_huff_count);
      first_pass_init(this);
    }
    this_local._7_1_ = (bool)(this->m_all_stream_writes_succeeded & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool jpeg_encoder::jpg_open(int p_x_res, int p_y_res, int src_channels)
	{
		m_num_components = 3;
		switch (m_params.m_subsampling)
		{
		case Y_ONLY:
		{
			m_num_components = 1;
			m_comp_h_samp[0] = 1; m_comp_v_samp[0] = 1;
			m_mcu_x = 8; m_mcu_y = 8;
			break;
		}
		case H1V1:
		{
			m_comp_h_samp[0] = 1; m_comp_v_samp[0] = 1;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 8; m_mcu_y = 8;
			break;
		}
		case H2V1:
		{
			m_comp_h_samp[0] = 2; m_comp_v_samp[0] = 1;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 16; m_mcu_y = 8;
			break;
		}
		case H2V2:
		{
			m_comp_h_samp[0] = 2; m_comp_v_samp[0] = 2;
			m_comp_h_samp[1] = 1; m_comp_v_samp[1] = 1;
			m_comp_h_samp[2] = 1; m_comp_v_samp[2] = 1;
			m_mcu_x = 16; m_mcu_y = 16;
		}
		}

		m_image_x = p_x_res; m_image_y = p_y_res;
		m_image_bpp = src_channels;
		m_image_bpl = m_image_x * src_channels;
		m_image_x_mcu = (m_image_x + m_mcu_x - 1) & (~(m_mcu_x - 1));
		m_image_y_mcu = (m_image_y + m_mcu_y - 1) & (~(m_mcu_y - 1));
		m_image_bpl_xlt = m_image_x * m_num_components;
		m_image_bpl_mcu = m_image_x_mcu * m_num_components;
		m_mcus_per_row = m_image_x_mcu / m_mcu_x;

		if ((m_mcu_lines[0] = static_cast<uint8*>(jpge_malloc(m_image_bpl_mcu * m_mcu_y))) == NULL) return false;
		for (int i = 1; i < m_mcu_y; i++)
			m_mcu_lines[i] = m_mcu_lines[i - 1] + m_image_bpl_mcu;

		if (m_params.m_use_std_tables)
		{
			compute_quant_table(m_quantization_tables[0], s_std_lum_quant);
			compute_quant_table(m_quantization_tables[1], m_params.m_no_chroma_discrim_flag ? s_std_lum_quant : s_std_croma_quant);
		}
		else
		{
			compute_quant_table(m_quantization_tables[0], s_alt_quant);
			memcpy(m_quantization_tables[1], m_quantization_tables[0], sizeof(m_quantization_tables[1]));
		}

		m_out_buf_left = JPGE_OUT_BUF_SIZE;
		m_pOut_buf = m_out_buf;

		if (m_params.m_two_pass_flag)
		{
			clear_obj(m_huff_count);
			first_pass_init();
		}
		else
		{
			memcpy(m_huff_bits[0 + 0], s_dc_lum_bits, 17);    memcpy(m_huff_val[0 + 0], s_dc_lum_val, DC_LUM_CODES);
			memcpy(m_huff_bits[2 + 0], s_ac_lum_bits, 17);    memcpy(m_huff_val[2 + 0], s_ac_lum_val, AC_LUM_CODES);
			memcpy(m_huff_bits[0 + 1], s_dc_chroma_bits, 17); memcpy(m_huff_val[0 + 1], s_dc_chroma_val, DC_CHROMA_CODES);
			memcpy(m_huff_bits[2 + 1], s_ac_chroma_bits, 17); memcpy(m_huff_val[2 + 1], s_ac_chroma_val, AC_CHROMA_CODES);
			if (!second_pass_init()) return false;   // in effect, skip over the first pass
		}
		return m_all_stream_writes_succeeded;
	}